

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::FunctionPointerPrinter::
     PrintValue<void(*(unsigned_char))(unsigned_char_const*,int,unsigned_short*),void>
               (_func__func_void_uchar_ptr_int_unsigned_short_ptr_ptr_uchar *p,ostream *os)

{
  if (p != (_func__func_void_uchar_ptr_int_unsigned_short_ptr_ptr_uchar *)0x0) {
    std::ostream::_M_insert<void_const*>(os);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"NULL",4);
  return;
}

Assistant:

static void PrintValue(T* p, ::std::ostream* os) {
    if (p == nullptr) {
      *os << "NULL";
    } else {
      // T is a function type, so '*os << p' doesn't do what we want
      // (it just prints p as bool).  We want to print p as a const
      // void*.
      *os << reinterpret_cast<const void*>(p);
    }
  }